

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,signed_char,duckdb::UnaryOperatorWrapper,duckdb::HugeIntBitCntOperator>
               (hugeint_t *ldata,char *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t extraout_RDX;
  idx_t iVar6;
  idx_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t extraout_RDX_03;
  int64_t iVar7;
  idx_t iVar8;
  int64_t *piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar9 = &ldata->upper;
    iVar6 = count;
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      input.upper = iVar6;
      input.lower = *piVar9;
      cVar3 = HugeIntBitCntOperator::Operation<duckdb::hugeint_t,signed_char>
                        ((HugeIntBitCntOperator *)((hugeint_t *)(piVar9 + -1))->lower,input);
      result_data[iVar8] = cVar3;
      piVar9 = piVar9 + 2;
      iVar6 = extraout_RDX_00;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      iVar7 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      iVar7 = extraout_RDX_01;
    }
    uVar11 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
LAB_007581ea:
        piVar9 = &ldata[uVar11].upper;
        for (; uVar4 = uVar11, uVar11 < uVar12; uVar11 = uVar11 + 1) {
          input_00.upper = iVar7;
          input_00.lower = *piVar9;
          cVar3 = HugeIntBitCntOperator::Operation<duckdb::hugeint_t,signed_char>
                            ((HugeIntBitCntOperator *)((hugeint_t *)(piVar9 + -1))->lower,input_00);
          result_data[uVar11] = cVar3;
          piVar9 = piVar9 + 2;
          iVar7 = extraout_RDX_02;
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_007581ea;
        uVar4 = uVar12;
        if (uVar2 != 0) {
          piVar9 = &ldata[uVar11].upper;
          for (uVar10 = 0; uVar4 = uVar11 + uVar10, uVar11 + uVar10 < uVar12; uVar10 = uVar10 + 1) {
            if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
              input_01.upper = iVar7;
              input_01.lower = *piVar9;
              cVar3 = HugeIntBitCntOperator::Operation<duckdb::hugeint_t,signed_char>
                                ((HugeIntBitCntOperator *)((hugeint_t *)(piVar9 + -1))->lower,
                                 input_01);
              result_data[uVar10 + uVar11] = cVar3;
              iVar7 = extraout_RDX_03;
            }
            piVar9 = piVar9 + 2;
          }
        }
      }
      uVar11 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}